

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_4.cpp
# Opt level: O2

optional<int> parse_and_evaluate(string *_expression)

{
  ulong uVar1;
  _Optional_payload_base<int> _Var2;
  optional<Operator> oVar3;
  optional<int> oVar4;
  ostream *poVar5;
  _Storage<int,_true> _Var6;
  _Storage<int,_true> _Var7;
  _Optional_payload_base<int> unaff_RBX;
  char *pcVar8;
  ulong uVar9;
  size_t parseOffset;
  
  parseOffset = 0;
  _Var2 = (_Optional_payload_base<int>)parse_number(_expression,&parseOffset);
  if (((ulong)_Var2 >> 0x20 & 1) == 0) {
    pcVar8 = "Could not parse first number.\n";
    _Var2 = unaff_RBX;
LAB_00101359:
    std::operator<<((ostream *)&std::cerr,pcVar8);
LAB_00101430:
    uVar9 = 0;
  }
  else {
    uVar9 = 0x100000000;
    uVar1 = _expression->_M_string_length;
    while (parseOffset < uVar1) {
      oVar3 = parse_operator(_expression,&parseOffset);
      if (((ulong)oVar3.super__Optional_base<Operator,_true,_true>._M_payload.
                  super__Optional_payload_base<Operator> & 0x100000000) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Failed to parse operator at offset: ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5,'\n');
        break;
      }
      oVar4 = parse_number(_expression,&parseOffset);
      if (((ulong)oVar4.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> & 0x100000000) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Failed to parse next operand at offset ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5,'\n');
        goto LAB_00101430;
      }
      _Var6._M_value =
           oVar4.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      _Var7 = _Var2._M_payload;
      switch((ulong)oVar3.super__Optional_base<Operator,_true,_true>._M_payload.
                    super__Optional_payload_base<Operator> & 0xffffffff) {
      case 0:
        _Var2._M_payload = _Var7._M_value + _Var6._M_value;
        _Var2._4_4_ = 0;
        break;
      case 1:
        _Var2._M_payload = _Var7._M_value - (int)_Var6;
        _Var2._4_4_ = 0;
        break;
      case 2:
        _Var2._M_payload = _Var7._M_value * _Var6._M_value;
        _Var2._4_4_ = 0;
        break;
      case 3:
        if (_Var6._M_value == 0) {
          pcVar8 = "Division by zero is undefined.\n";
          goto LAB_00101359;
        }
        _Var2 = (_Optional_payload_base<int>)
                ((long)((ulong)(uint)(_Var7._M_value >> 0x1f) << 0x20 | (ulong)_Var2 & 0xffffffff) /
                 (long)_Var6._M_value & 0xffffffff);
      }
    }
  }
  return (optional<int>)((ulong)_Var2 & 0xffffffff | uVar9);
}

Assistant:

optional<number_type> parse_and_evaluate(string const& _expression)
{
	size_t parseOffset = 0;
	optional<number_type> const first_value = parse_number(_expression, parseOffset);
	if (!first_value.has_value())
	{
		cerr << "Could not parse first number.\n";
		return nullopt;
	}

	number_type result = first_value.value();

	while (parseOffset < _expression.size())
	{
		optional<Operator> const op = parse_operator(_expression, parseOffset);
		if (!op.has_value())
		{
			cerr << "Failed to parse operator at offset: " << parseOffset << '\n';
			break;
		}

		optional<number_type> const rhs = parse_number(_expression, parseOffset);
		if (!rhs.has_value())
		{
			cerr << "Failed to parse next operand at offset " << parseOffset << '\n';
			return nullopt;
		}

		switch (op.value())
		{
			case Operator::Plus:
				result = result + rhs.value();
				break;
			case Operator::Minus:
				result = result - rhs.value();
				break;
			case Operator::Multiply:
				result = result * rhs.value();
				break;
			case Operator::Divide:
				if (rhs.value() != 0)
					result = result / rhs.value();
				else
				{
					cerr << "Division by zero is undefined.\n";
					return nullopt;
				}
				break;
		}
	}
	return result;
}